

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O2

void __thiscall
OpenMD::SelectionEvaluator::invalidIndexRange(SelectionEvaluator *this,pair<int,_int> range)

{
  pair<int,_int> local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  local_d8 = range;
  toString<int>(&local_30,&local_d8.first);
  std::operator+(&local_b0,"invalid index range: [",&local_30);
  std::operator+(&local_90,&local_b0,", ");
  toString<int>(&local_d0,&local_d8.second);
  std::operator+(&local_70,&local_90,&local_d0);
  std::operator+(&local_50,&local_70,")");
  evalError(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void invalidIndexRange(std::pair<int, int> range) {
      evalError("invalid index range: [" + toString(range.first) + ", " +
                toString(range.second) + ")");
    }